

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FullSegment.hpp
# Opt level: O2

void __thiscall
cppjieba::FullSegment::Cut
          (FullSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res)

{
  ulong uVar1;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> *ppVar2;
  ulong uVar3;
  long lVar4;
  uint __line;
  pointer pDVar5;
  ulong uVar6;
  char *__assertion;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  WordRange wr;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> dags;
  LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> tRes;
  
  memset(&tRes,0,0x100);
  tRes.size_ = 0;
  tRes.capacity_ = 0x10;
  tRes.ptr_ = tRes.buffer_;
  if (this->dictTrie_ == (DictTrie *)0x0) {
    __assertion = "dictTrie_";
    __line = 0x3e;
LAB_0010be35:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/FullSegment.hpp"
                  ,__line,
                  "void cppjieba::FullSegment::Cut(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<WordRange> &) const"
                 );
  }
  dags.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dags.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dags.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DictTrie::Find(this->dictTrie_,begin,end,&dags,0x200);
  uVar7 = 0;
  uVar6 = 0;
  uVar10 = 0;
  pDVar5 = dags.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if ((ulong)(((long)dags.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pDVar5) / 0x148) <= uVar6)
    {
      std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::~vector(&dags);
      limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::~LocalVector
                (&tRes);
      return;
    }
    lVar9 = 8;
    for (uVar8 = 0; uVar1 = pDVar5[uVar6].nexts.size_, uVar8 < uVar1; uVar8 = uVar8 + 1) {
      ppVar2 = pDVar5[uVar6].nexts.ptr_;
      uVar3 = *(ulong *)((long)ppVar2 + lVar9 + -8);
      if ((ulong)(((long)dags.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pDVar5) / 0x148) <= uVar3
         ) {
        __assertion = "nextoffset < dags.size()";
        __line = 0x44;
        goto LAB_0010be35;
      }
      lVar4 = *(long *)((long)&ppVar2->first + lVar9);
      if (lVar4 == 0) {
        if ((uVar1 == 1) && (uVar10 <= uVar6)) {
          wr.right = begin + uVar3;
          wr.left = begin + uVar6;
          std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back(res,&wr)
          ;
        }
      }
      else {
        uVar7 = *(ulong *)(lVar4 + 0x48);
        if ((1 < uVar7) || ((uVar1 == 1 && (uVar10 <= uVar6)))) {
          wr.right = begin + uVar3;
          wr.left = begin + uVar6;
          std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back(res,&wr)
          ;
        }
      }
      if (uVar10 < uVar7 + uVar6) {
        uVar10 = uVar7 + uVar6;
      }
      lVar9 = lVar9 + 0x10;
      pDVar5 = dags.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void Cut(RuneStrArray::const_iterator begin, 
        RuneStrArray::const_iterator end, 
        vector<WordRange>& res) const {
    // resut of searching in trie tree
    LocalVector<pair<size_t, const DictUnit*> > tRes;

    // max index of res's words
    size_t maxIdx = 0;

    // always equals to (uItr - begin)
    size_t uIdx = 0;

    // tmp variables
    size_t wordLen = 0;
    assert(dictTrie_);
    vector<struct Dag> dags;
    dictTrie_->Find(begin, end, dags);
    for (size_t i = 0; i < dags.size(); i++) {
      for (size_t j = 0; j < dags[i].nexts.size(); j++) {
        size_t nextoffset = dags[i].nexts[j].first;
        assert(nextoffset < dags.size());
        const DictUnit* du = dags[i].nexts[j].second;
        if (du == NULL) {
          if (dags[i].nexts.size() == 1 && maxIdx <= uIdx) {
            WordRange wr(begin + i, begin + nextoffset);
            res.push_back(wr);
          }
        } else {
          wordLen = du->word.size();
          if (wordLen >= 2 || (dags[i].nexts.size() == 1 && maxIdx <= uIdx)) {
            WordRange wr(begin + i, begin + nextoffset);
            res.push_back(wr);
          }
        }
        maxIdx = uIdx + wordLen > maxIdx ? uIdx + wordLen : maxIdx;
      }
      uIdx++;
    }
  }